

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::send_spi(Spi *this,uint8_t *data,int n)

{
  ostream *this_00;
  uint local_24;
  int local_20;
  DWORD dwNumBytesSent;
  FT_STATUS ftStatus;
  int n_local;
  uint8_t *data_local;
  Spi *this_local;
  
  if (0 < n) {
    dwNumBytesSent = n;
    _ftStatus = data;
    data_local = (uint8_t *)this;
    send_byte(this,'\x11');
    send_byte(this,(char)dwNumBytesSent + 0xff);
    send_byte(this,(uint8_t)(dwNumBytesSent - 1 >> 8));
    local_24 = 0;
    local_20 = FT_Write(this->ftHandle,_ftStatus,dwNumBytesSent,&local_24);
    if (local_20 != 0) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Write error!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      error(this,2);
    }
    if (local_24 != dwNumBytesSent) {
      fprintf(_stderr,"Write error (chunk, rc=%u, expected %d).\n",(ulong)local_24,
              (ulong)dwNumBytesSent);
      error(this,2);
    }
  }
  return;
}

Assistant:

void Spi::send_spi(uint8_t *data, int n) {
	if (n < 1)
		return;

	/* Output only, update data on negative clock edge. */
	send_byte(MC_DATA_OUT | MC_DATA_OCN);
	send_byte(n - 1);
	send_byte((n - 1) >> 8);

	FT_STATUS ftStatus;
	DWORD dwNumBytesSent = 0;

	ftStatus = FT_Write(ftHandle, data, n, &dwNumBytesSent);
	if (ftStatus != FT_OK) {
		cerr << "Write error!" << endl;
		error(2);
	}

	if (dwNumBytesSent != (unsigned int) n) {
		fprintf(stderr, "Write error (chunk, rc=%u, expected %d).\n",
				dwNumBytesSent, n);
		error(2);
	}
}